

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_writer_add_mem_ex
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32)

{
  mz_uint64 mVar1;
  mz_uint64 cur_file_ofs;
  mz_zip_internal_state *pArray;
  mz_bool mVar2;
  mz_uint mVar3;
  tdefl_status tVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  mz_ulong mVar9;
  void *pvVar10;
  bool bVar11;
  bool local_171;
  char *local_170;
  mz_zip_writer_add_state state;
  time_t cur_time;
  mz_zip_internal_state *pState;
  tdefl_compressor *ptStack_140;
  mz_bool store_data_uncompressed;
  tdefl_compressor *pComp;
  mz_uint8 local_dir_header [30];
  size_t archive_name_size;
  mz_uint64 comp_size;
  mz_uint64 cur_archive_file_ofs;
  mz_uint64 local_dir_header_ofs;
  mz_uint32 local_e8;
  mz_uint num_alignment_padding_bytes;
  mz_uint ext_attributes;
  mz_uint level;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint16 method;
  mz_uint16 comment_size_local;
  void *pComment_local;
  size_t buf_size_local;
  void *pBuf_local;
  char *pArchive_name_local;
  mz_zip_archive *pZip_local;
  undefined8 local_a8;
  mz_zip_array *local_a0;
  char *local_98;
  long local_90;
  mz_zip_internal_state *local_88;
  char *local_80;
  undefined4 local_74;
  ulong local_70;
  mz_zip_internal_state *local_68;
  char *local_60;
  int local_58;
  undefined4 local_54;
  ulong local_50;
  mz_zip_array *local_48;
  char *local_40;
  int local_34;
  
  level._0_2_ = 0;
  ext_attributes._2_2_ = 0;
  ext_attributes._0_2_ = 0;
  local_e8 = 0;
  mVar1 = pZip->m_archive_size;
  cur_file_ofs = pZip->m_archive_size;
  archive_name_size = 0;
  ptStack_140 = (tdefl_compressor *)0x0;
  if ((int)level_and_flags < 0) {
    level_and_flags = 6;
  }
  num_alignment_padding_bytes = level_and_flags & 0xf;
  bVar11 = (level_and_flags & 0x400) != 0;
  local_171 = num_alignment_padding_bytes == 0 || bVar11;
  if (((((((pZip != (mz_zip_archive *)0x0) && (pZip->m_pState != (mz_zip_internal_state *)0x0)) &&
         (pZip->m_zip_mode == MZ_ZIP_MODE_WRITING)) && ((buf_size == 0 || (pBuf != (void *)0x0))))
       && (pArchive_name != (char *)0x0)) &&
      (((comment_size == 0 || (pComment != (void *)0x0)) &&
       ((pZip->m_total_files != 0xffff && (num_alignment_padding_bytes < 0xb)))))) &&
     ((((pArray = pZip->m_pState, (level_and_flags & 0x400) != 0 || (uncomp_size == 0)) &&
       (buf_size < 0x100000000)) &&
      ((uncomp_size < 0x100000000 &&
       (level._2_2_ = comment_size, _dos_date = pComment, pComment_local = (void *)buf_size,
       buf_size_local = (size_t)pBuf, pBuf_local = pArchive_name, pArchive_name_local = (char *)pZip
       , mVar2 = (anonymous_namespace)::miniz::mz_zip_writer_validate_archive_name(pArchive_name),
       mVar2 != 0)))))) {
    time((time_t *)&state.m_comp_size);
    (anonymous_namespace)::miniz::mz_zip_time_to_dos_time
              (state.m_comp_size,(mz_uint16 *)((long)&ext_attributes + 2),
               (mz_uint16 *)&ext_attributes);
    sVar5 = strlen((char *)pBuf_local);
    if (((sVar5 < 0x10000) &&
        ((mVar3 = (anonymous_namespace)::miniz::
                  mz_zip_writer_compute_padding_needed_for_file_alignment
                            ((mz_zip_archive *)pArchive_name_local),
         *(int *)(pArchive_name_local + 0x10) != 0xffff &&
         (*(long *)pArchive_name_local + (ulong)mVar3 + 0x4c + (ulong)level._2_2_ + sVar5 <
          0x100000000)))) &&
       (((sVar5 == 0 || (*(char *)((long)pBuf_local + (sVar5 - 1)) != '/')) ||
        ((local_e8 = 0x10, pComment_local == (void *)0x0 && (uncomp_size == 0)))))) {
      local_90 = sVar5 + 0x2e + (ulong)level._2_2_;
      local_80 = pArchive_name_local;
      local_70 = (pArray->m_central_dir).m_size + local_90;
      local_60 = pArchive_name_local;
      local_74 = 1;
      local_88 = pArray;
      local_68 = pArray;
      if (((pArray->m_central_dir).m_capacity < local_70) &&
         (mVar2 = (anonymous_namespace)::miniz::mz_zip_array_ensure_capacity
                            ((mz_zip_archive *)pArchive_name_local,&pArray->m_central_dir,local_70,1
                            ), mVar2 == 0)) {
        local_58 = 0;
      }
      else {
        local_58 = 1;
      }
      if (local_58 != 0) {
        local_a0 = &pArray->m_central_dir_offsets;
        local_98 = pArchive_name_local;
        local_a8 = 1;
        local_50 = (pArray->m_central_dir_offsets).m_size + 1;
        local_40 = pArchive_name_local;
        local_54 = 1;
        local_48 = local_a0;
        if (((pArray->m_central_dir_offsets).m_capacity < local_50) &&
           (mVar2 = (anonymous_namespace)::miniz::mz_zip_array_ensure_capacity
                              ((mz_zip_archive *)pArchive_name_local,local_a0,local_50,1),
           mVar2 == 0)) {
          local_34 = 0;
        }
        else {
          local_34 = 1;
        }
        if (local_34 != 0) {
          if (((num_alignment_padding_bytes != 0 && !bVar11) && (pComment_local != (void *)0x0)) &&
             (ptStack_140 = (tdefl_compressor *)
                            (**(code **)(pArchive_name_local + 0x20))
                                      (*(undefined8 *)(pArchive_name_local + 0x38),1,0x4df78),
             ptStack_140 == (tdefl_compressor *)0x0)) {
            return 0;
          }
          mVar2 = (anonymous_namespace)::miniz::mz_zip_writer_write_zeros
                            ((mz_zip_archive *)pArchive_name_local,cur_file_ofs,mVar3 + 0x1e);
          if (mVar2 == 0) {
            (**(code **)(pArchive_name_local + 0x28))
                      (*(undefined8 *)(pArchive_name_local + 0x38),ptStack_140);
            return 0;
          }
          uVar6 = mVar3 + mVar1;
          if ((*(int *)(pArchive_name_local + 0x18) != 0) &&
             ((uVar6 & *(int *)(pArchive_name_local + 0x18) - 1) != 0)) {
            __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                          ,0x17ca,
                          "mz_bool (anonymous namespace)::miniz::mz_zip_writer_add_mem_ex(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32)"
                         );
          }
          lVar7 = (ulong)mVar3 + 0x1e + cur_file_ofs;
          memset(&pComp,0,0x1e);
          sVar8 = (**(code **)(pArchive_name_local + 0x48))
                            (*(undefined8 *)(pArchive_name_local + 0x50),lVar7,pBuf_local,sVar5);
          if (sVar8 != sVar5) {
            (**(code **)(pArchive_name_local + 0x28))
                      (*(undefined8 *)(pArchive_name_local + 0x38),ptStack_140);
            return 0;
          }
          comp_size = sVar5 + lVar7;
          if ((level_and_flags & 0x400) == 0) {
            mVar9 = mz_crc32(0,(mz_uint8 *)buf_size_local,(size_t)pComment_local);
            uncomp_crc32 = (mz_uint32)mVar9;
            uncomp_size = (mz_uint64)pComment_local;
            if (pComment_local < (void *)0x4) {
              num_alignment_padding_bytes = 0;
              local_171 = true;
            }
          }
          if (local_171) {
            pvVar10 = (void *)(**(code **)(pArchive_name_local + 0x48))
                                        (*(undefined8 *)(pArchive_name_local + 0x50),comp_size,
                                         buf_size_local,pComment_local);
            if (pvVar10 != pComment_local) {
              (**(code **)(pArchive_name_local + 0x28))
                        (*(undefined8 *)(pArchive_name_local + 0x38),ptStack_140);
              return 0;
            }
            comp_size = (long)pComment_local + comp_size;
            archive_name_size = (size_t)pComment_local;
            if ((level_and_flags & 0x400) != 0) {
              level._0_2_ = 8;
            }
          }
          else if (pComment_local != (void *)0x0) {
            local_170 = pArchive_name_local;
            state.m_cur_archive_file_ofs = 0;
            state.m_pZip = (mz_zip_archive *)comp_size;
            mVar3 = tdefl_create_comp_flags_from_zip_params(num_alignment_padding_bytes,-0xf,0);
            tVar4 = tdefl_init(ptStack_140,
                               (anonymous_namespace)::miniz::mz_zip_writer_add_put_buf_callback,
                               &local_170,mVar3);
            if ((tVar4 != TDEFL_STATUS_OKAY) ||
               (tVar4 = tdefl_compress_buffer
                                  (ptStack_140,(void *)buf_size_local,(size_t)pComment_local,
                                   TDEFL_FINISH), tVar4 != TDEFL_STATUS_DONE)) {
              (**(code **)(pArchive_name_local + 0x28))
                        (*(undefined8 *)(pArchive_name_local + 0x38),ptStack_140);
              return 0;
            }
            archive_name_size = state.m_cur_archive_file_ofs;
            comp_size = (mz_uint64)state.m_pZip;
            level._0_2_ = 8;
          }
          (**(code **)(pArchive_name_local + 0x28))
                    (*(undefined8 *)(pArchive_name_local + 0x38),ptStack_140);
          if ((archive_name_size < 0x100000000) && (comp_size < 0x100000000)) {
            mVar2 = (anonymous_namespace)::miniz::mz_zip_writer_create_local_dir_header
                              ((mz_zip_archive *)pArchive_name_local,(mz_uint8 *)&pComp,
                               (mz_uint16)sVar5,0,uncomp_size,archive_name_size,uncomp_crc32,
                               (mz_uint16)level,0,ext_attributes._2_2_,(mz_uint16)ext_attributes);
            if (mVar2 == 0) {
              return 0;
            }
            lVar7 = (**(code **)(pArchive_name_local + 0x48))
                              (*(undefined8 *)(pArchive_name_local + 0x50),uVar6,&pComp,0x1e);
            if (lVar7 == 0x1e) {
              mVar2 = (anonymous_namespace)::miniz::mz_zip_writer_add_to_central_dir
                                ((mz_zip_archive *)pArchive_name_local,(char *)pBuf_local,
                                 (mz_uint16)sVar5,(void *)0x0,0,_dos_date,level._2_2_,uncomp_size,
                                 archive_name_size,uncomp_crc32,(mz_uint16)level,0,
                                 ext_attributes._2_2_,(mz_uint16)ext_attributes,uVar6,local_e8);
              if (mVar2 != 0) {
                *(int *)(pArchive_name_local + 0x10) = *(int *)(pArchive_name_local + 0x10) + 1;
                *(mz_uint64 *)pArchive_name_local = comp_size;
                return 1;
              }
              return 0;
            }
            return 0;
          }
          return 0;
        }
      }
    }
  }
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_mem_ex(mz_zip_archive *pZip,
                                 const char *pArchive_name, const void *pBuf,
                                 size_t buf_size, const void *pComment,
                                 mz_uint16 comment_size,
                                 mz_uint level_and_flags, mz_uint64 uncomp_size,
                                 mz_uint32 uncomp_crc32) {
  mz_uint16 method = 0, dos_time = 0, dos_date = 0;
  mz_uint level, ext_attributes = 0, num_alignment_padding_bytes;
  mz_uint64 local_dir_header_ofs = pZip->m_archive_size,
            cur_archive_file_ofs = pZip->m_archive_size, comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  tdefl_compressor *pComp = NULL;
  mz_bool store_data_uncompressed;
  mz_zip_internal_state *pState;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;
  store_data_uncompressed =
      ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

  if ((!pZip) || (!pZip->m_pState) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf)) ||
      (!pArchive_name) || ((comment_size) && (!pComment)) ||
      (pZip->m_total_files == 0xFFFF) || (level > MZ_UBER_COMPRESSION))
    return MZ_FALSE;

  pState = pZip->m_pState;

  if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
    return MZ_FALSE;
  // No zip64 support yet
  if ((buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF))
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;

#ifndef MINIZ_NO_TIME
  {
    time_t cur_time;
    time(&cur_time);
    mz_zip_time_to_dos_time(cur_time, &dos_time, &dos_date);
  }
#endif // #ifndef MINIZ_NO_TIME

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > 0xFFFF)
    return MZ_FALSE;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
        comment_size + archive_name_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/')) {
    // Set DOS Subdirectory attribute bit.
    ext_attributes |= 0x10;
    // Subdirectories cannot contain data.
    if ((buf_size) || (uncomp_size))
      return MZ_FALSE;
  }

  // Try to do any allocations before writing to the archive, so if an
  // allocation fails the file remains unmodified. (A good idea if we're doing
  // an in-place modification.)
  if ((!mz_zip_array_ensure_room(pZip, &pState->m_central_dir,
                                 MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                                     archive_name_size + comment_size)) ||
      (!mz_zip_array_ensure_room(pZip, &pState->m_central_dir_offsets, 1)))
    return MZ_FALSE;

  if ((!store_data_uncompressed) && (buf_size)) {
    if (NULL == (pComp = (tdefl_compressor *)pZip->m_pAlloc(
                     pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
      return MZ_FALSE;
  }

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs,
                                 num_alignment_padding_bytes +
                                     sizeof(local_dir_header))) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    return MZ_FALSE;
  }
  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }
  cur_archive_file_ofs +=
      num_alignment_padding_bytes + sizeof(local_dir_header);

  MZ_CLEAR_OBJ(local_dir_header);
  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                     archive_name_size) != archive_name_size) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    return MZ_FALSE;
  }
  cur_archive_file_ofs += archive_name_size;

  if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
    uncomp_crc32 =
        (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf, buf_size);
    uncomp_size = buf_size;
    if (uncomp_size <= 3) {
      level = 0;
      store_data_uncompressed = MZ_TRUE;
    }
  }

  if (store_data_uncompressed) {
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf,
                       buf_size) != buf_size) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return MZ_FALSE;
    }

    cur_archive_file_ofs += buf_size;
    comp_size = buf_size;

    if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
      method = MZ_DEFLATED;
  } else if (buf_size) {
    mz_zip_writer_add_state state;

    state.m_pZip = pZip;
    state.m_cur_archive_file_ofs = cur_archive_file_ofs;
    state.m_comp_size = 0;

    if ((tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state,
                    tdefl_create_comp_flags_from_zip_params(
                        level, -15, MZ_DEFAULT_STRATEGY)) !=
         TDEFL_STATUS_OKAY) ||
        (tdefl_compress_buffer(pComp, pBuf, buf_size, TDEFL_FINISH) !=
         TDEFL_STATUS_DONE)) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return MZ_FALSE;
    }

    comp_size = state.m_comp_size;
    cur_archive_file_ofs = state.m_cur_archive_file_ofs;

    method = MZ_DEFLATED;
  }

  pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
  pComp = NULL;

  // no zip64 support yet
  if ((comp_size > 0xFFFFFFFF) || (cur_archive_file_ofs > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_local_dir_header(
          pZip, local_dir_header, (mz_uint16)archive_name_size, 0, uncomp_size,
          comp_size, uncomp_crc32, method, 0, dos_time, dos_date))
    return MZ_FALSE;

  if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header,
                     sizeof(local_dir_header)) != sizeof(local_dir_header))
    return MZ_FALSE;

  if (!mz_zip_writer_add_to_central_dir(
          pZip, pArchive_name, (mz_uint16)archive_name_size, NULL, 0, pComment,
          comment_size, uncomp_size, comp_size, uncomp_crc32, method, 0,
          dos_time, dos_date, local_dir_header_ofs, ext_attributes))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}